

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports-runtime.cpp
# Opt level: O0

void __thiscall
rtosc::helpers::CapturePretty::reply_va(CapturePretty *this,char *args,__va_list_tag *va)

{
  int cols_used;
  char *buffer;
  size_t bs;
  long lVar1;
  rtosc_arg_val_t *args_00;
  size_t n;
  undefined8 uStack_60;
  undefined1 auStack_58 [16];
  rtosc_arg_val_t *local_48;
  size_t wrt;
  unsigned_long __vla_expr0;
  size_t local_28;
  size_t nargs;
  __va_list_tag *va_local;
  char *args_local;
  CapturePretty *this_local;
  
  uStack_60 = 0x11c695;
  auStack_58._8_8_ = this;
  nargs = (size_t)va;
  va_local = (__va_list_tag *)args;
  args_local = (char *)this;
  local_28 = strlen(args);
  __vla_expr0 = (unsigned_long)auStack_58;
  lVar1 = -(local_28 * 0x18 + 0xf & 0xfffffffffffffff0);
  local_48 = (rtosc_arg_val_t *)(auStack_58 + lVar1);
  wrt = local_28;
  *(undefined8 *)(auStack_58 + lVar1 + -8) = 0x11c6d6;
  rtosc_v2argvals(*(rtosc_arg_val_t **)((long)&nargs + lVar1),*(size_t *)((long)&local_28 + lVar1),
                  *(char **)((long)&__vla_expr0 + lVar1),*(__va_list_tag **)((long)&wrt + lVar1));
  n = local_28;
  args_00 = local_48;
  buffer = *(char **)(auStack_58._8_8_ + 0x78);
  bs = *(size_t *)(auStack_58._8_8_ + 0x80);
  cols_used = *(int *)(auStack_58._8_8_ + 0x88);
  *(undefined8 *)(auStack_58 + lVar1 + -8) = 0x11c6fe;
  rtosc_print_arg_vals(args_00,n,buffer,bs,(rtosc_print_options *)0x0,cols_used);
  return;
}

Assistant:

void reply_va(const char *args, va_list va)
    {
        size_t nargs = strlen(args);
        STACKALLOC(rtosc_arg_val_t, arg_vals, nargs);

        rtosc_v2argvals(arg_vals, nargs, args, va);

        size_t wrt = rtosc_print_arg_vals(arg_vals, nargs,
                                          buffer, buffersize, NULL,
                                          cols_used);
        assert(wrt);
        (void)wrt;
    }